

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O2

void __thiscall AV1Kmeans::AV1KmeansTest2::SetUp(AV1KmeansTest2 *this)

{
  byte bVar1;
  int i;
  long lVar2;
  
  (this->rnd_).random_.state_ = 0xbaba;
  for (lVar2 = 0; lVar2 != 0x2000; lVar2 = lVar2 + 1) {
    bVar1 = libaom_test::ACMRandom::Rand8(&this->rnd_);
    this->data_[lVar2] = (ushort)bVar1;
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    bVar1 = libaom_test::ACMRandom::Rand8(&this->rnd_);
    this->centroids_[lVar2] = (ushort)bVar1;
  }
  return;
}

Assistant:

void AV1KmeansTest2::SetUp() {
  rnd_.Reset(libaom_test::ACMRandom::DeterministicSeed());
  for (int i = 0; i < 4096 * 2; ++i) {
    data_[i] = (int)rnd_.Rand8();
  }
  for (int i = 0; i < 8 * 2; i++) {
    centroids_[i] = (int)rnd_.Rand8();
  }
}